

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aprog.c
# Opt level: O0

void tick_prog_ilopheth(AREA_DATA_conflict *area)

{
  ROOM_INDEX_DATA *pRVar1;
  ROOM_INDEX_DATA *pRoomIndex;
  char *pcVar2;
  char *pcVar3;
  OBJ_DATA *obj_00;
  long in_RDI;
  bool sph_found;
  char buf [4608];
  ROOM_INDEX_DATA *portroom;
  ROOM_INDEX_DATA *pedroom;
  OBJ_DATA *obj;
  OBJ_DATA *new_portal;
  OBJ_DATA *old_portal;
  OBJ_DATA *sphere;
  OBJ_DATA *pedestal;
  CHAR_DATA **in_stack_ffffffffffffec68;
  CHAR_DATA **in_stack_ffffffffffffec70;
  CHAR_DATA *in_stack_ffffffffffffec78;
  int vnum;
  char *in_stack_ffffffffffffec80;
  CHAR_DATA *in_stack_ffffffffffffec88;
  OBJ_DATA *in_stack_ffffffffffffec90;
  OBJ_DATA *in_stack_ffffffffffffeca0;
  undefined4 in_stack_ffffffffffffecb0;
  undefined4 uVar4;
  char local_132c [4];
  CHAR_DATA *local_1328;
  CHAR_DATA *local_1320;
  allocator<char> local_1311;
  string local_1310 [39];
  allocator<char> local_12e9;
  string local_12e8 [4];
  int in_stack_ffffffffffffed1c;
  OBJ_INDEX_DATA *in_stack_ffffffffffffed20;
  allocator<char> local_12a9;
  string local_12a8 [55];
  allocator<char> local_1271;
  string local_1270 [39];
  char local_1249;
  char local_1248 [128];
  char (*in_stack_ffffffffffffee38) [87];
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr_obj_data_ptr_char_data_ptr_int
  *in_stack_ffffffffffffee40;
  string *in_stack_ffffffffffffee48;
  string *in_stack_ffffffffffffee50;
  undefined4 in_stack_ffffffffffffee58;
  int in_stack_ffffffffffffee5c;
  string *in_stack_ffffffffffffee60;
  int in_stack_ffffffffffffee6c;
  CQueue *in_stack_ffffffffffffee70;
  void **in_stack_ffffffffffffee78;
  char_data **in_stack_ffffffffffffee80;
  void **in_stack_ffffffffffffee88;
  void **in_stack_ffffffffffffee90;
  int *in_stack_ffffffffffffee98;
  OBJ_DATA *local_30;
  OBJ_DATA *local_28;
  OBJ_DATA *local_20;
  OBJ_DATA *local_10;
  
  local_10 = (OBJ_DATA *)0x0;
  local_20 = (OBJ_DATA *)0x0;
  local_28 = (OBJ_DATA *)0x0;
  pRVar1 = get_room_index((int)((ulong)in_stack_ffffffffffffec78 >> 0x20));
  pRoomIndex = get_room_index((int)((ulong)in_stack_ffffffffffffec78 >> 0x20));
  local_1249 = '\0';
  if ((((time_info.day == 0) || (time_info.day == 0xe)) &&
      ((time_info.hour == 0xf || (time_info.hour == 0x11)))) &&
     (((time_info.half & 1U) == 0 && (*(short *)(in_RDI + 0x15a) < 2)))) {
    for (local_30 = pRVar1->contents; local_30 != (OBJ_DATA *)0x0; local_30 = local_30->next_content
        ) {
      if (local_30->pIndexData->vnum == 0x2337) {
        local_10 = local_30;
        break;
      }
    }
    if (local_10 != (OBJ_DATA *)0x0) {
      for (local_30 = local_10->contains; local_30 != (OBJ_DATA *)0x0;
          local_30 = local_30->next_content) {
        if (local_30->pIndexData->vnum == 0x2338) {
          local_1249 = '\x01';
          break;
        }
      }
      if (time_info.hour == 0xf) {
        if (local_1249 == '\0') {
          if (pRVar1->people != (CHAR_DATA *)0x0) {
            pcVar2 = get_char_color(in_stack_ffffffffffffec88,in_stack_ffffffffffffec80);
            pcVar3 = END_COLOR(in_stack_ffffffffffffec78);
            sprintf(local_1248,
                    "%sAs the afternoon sun drops lower in the sky a single shaft of sunlight shines through a gap in the stones, coming to rest directly on the white marble pedestal.%s"
                    ,pcVar2,pcVar3);
            act(in_stack_ffffffffffffec80,in_stack_ffffffffffffec78,in_stack_ffffffffffffec70,
                in_stack_ffffffffffffec68,0);
          }
        }
        else {
          if (pRVar1->people != (CHAR_DATA *)0x0) {
            in_stack_ffffffffffffeca0 =
                 (OBJ_DATA *)get_char_color(in_stack_ffffffffffffec88,in_stack_ffffffffffffec80);
            pcVar3 = END_COLOR(in_stack_ffffffffffffec78);
            uVar4 = 0;
            pcVar2 = local_1248;
            sprintf(pcVar2,
                    "%sAs the afternoon sun drops lower in the sky a single shaft of sunlight shines through a gap in the stones, coming to rest directly on the white marble pedestal.%s"
                    ,in_stack_ffffffffffffeca0,pcVar3);
            act(in_stack_ffffffffffffec80,in_stack_ffffffffffffec78,in_stack_ffffffffffffec70,
                in_stack_ffffffffffffec68,0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uVar4,in_stack_ffffffffffffecb0),pcVar2,
                       (allocator<char> *)in_stack_ffffffffffffeca0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uVar4,in_stack_ffffffffffffecb0),pcVar2,
                       (allocator<char> *)in_stack_ffffffffffffeca0);
            CQueue::
            AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[92],char_data*&,decltype(nullptr),decltype(nullptr),int>
                      (in_stack_ffffffffffffee70,in_stack_ffffffffffffee6c,in_stack_ffffffffffffee60
                       ,(string *)CONCAT44(in_stack_ffffffffffffee5c,in_stack_ffffffffffffee58),
                       (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr_obj_data_ptr_char_data_ptr_int
                        *)in_stack_ffffffffffffee50,(char (*) [92])in_stack_ffffffffffffee48,
                       in_stack_ffffffffffffee80,in_stack_ffffffffffffee88,in_stack_ffffffffffffee90
                       ,in_stack_ffffffffffffee98);
            std::__cxx11::string::~string(local_12a8);
            std::allocator<char>::~allocator(&local_12a9);
            std::__cxx11::string::~string(local_1270);
            std::allocator<char>::~allocator(&local_1271);
            in_stack_ffffffffffffec90 = (OBJ_DATA *)&local_12e9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uVar4,in_stack_ffffffffffffecb0),pcVar2,
                       (allocator<char> *)in_stack_ffffffffffffeca0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uVar4,in_stack_ffffffffffffecb0),pcVar2,
                       (allocator<char> *)in_stack_ffffffffffffeca0);
            in_stack_ffffffffffffec68 = &pRVar1->people;
            local_1320 = (CHAR_DATA *)0x0;
            local_1328 = (CHAR_DATA *)0x0;
            local_132c[0] = '\x04';
            local_132c[1] = '\0';
            local_132c[2] = '\0';
            local_132c[3] = '\0';
            in_stack_ffffffffffffec80 = local_132c;
            in_stack_ffffffffffffec78 = (CHAR_DATA *)&local_1328;
            in_stack_ffffffffffffec70 = &local_1320;
            CQueue::
            AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[87],char_data*&,decltype(nullptr),decltype(nullptr),int>
                      ((CQueue *)in_stack_ffffffffffffee60,in_stack_ffffffffffffee5c,
                       in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40
                       ,in_stack_ffffffffffffee38,(char_data **)in_stack_ffffffffffffee70,
                       in_stack_ffffffffffffee78,in_stack_ffffffffffffee80,
                       (int *)in_stack_ffffffffffffee88);
            std::__cxx11::string::~string(local_1310);
            std::allocator<char>::~allocator(&local_1311);
            std::__cxx11::string::~string(local_12e8);
            std::allocator<char>::~allocator(&local_12e9);
          }
          for (local_30 = pRoomIndex->contents; local_30 != (OBJ_DATA *)0x0;
              local_30 = local_30->next_content) {
            if (local_30->pIndexData->vnum == 0x2331) {
              local_20 = local_30;
              break;
            }
          }
          if (local_20 == (OBJ_DATA *)0x0) {
            return;
          }
          if (pRoomIndex->people != (CHAR_DATA *)0x0) {
            sprintf(local_1248,
                    "The mass of energy begins to glow a brilliant white, and releases an immense pillar of energy which streaks into the heavens.  The disturbance seems to stabilize into an arched, opalescent portal."
                   );
            act(in_stack_ffffffffffffec80,in_stack_ffffffffffffec78,in_stack_ffffffffffffec70,
                in_stack_ffffffffffffec68,0);
          }
          obj_from_room(in_stack_ffffffffffffeca0);
          extract_obj(in_stack_ffffffffffffec90);
          get_obj_index((int)((ulong)in_stack_ffffffffffffec78 >> 0x20));
          local_28 = create_object(in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
          obj_to_room(local_28,pRoomIndex);
        }
      }
      if (time_info.hour == 0x11) {
        if (pRVar1->people != (CHAR_DATA *)0x0) {
          act(in_stack_ffffffffffffec80,in_stack_ffffffffffffec78,in_stack_ffffffffffffec70,
              in_stack_ffffffffffffec68,0);
        }
        for (local_30 = pRoomIndex->contents; local_30 != (OBJ_DATA *)0x0;
            local_30 = local_30->next_content) {
          if (local_30->pIndexData->vnum == 0x2330) {
            local_28 = local_30;
            break;
          }
        }
        if (local_28 != (OBJ_DATA *)0x0) {
          if (pRoomIndex->people != (CHAR_DATA *)0x0) {
            act(in_stack_ffffffffffffec80,in_stack_ffffffffffffec78,in_stack_ffffffffffffec70,
                in_stack_ffffffffffffec68,0);
          }
          vnum = (int)((ulong)in_stack_ffffffffffffec78 >> 0x20);
          obj_from_room(in_stack_ffffffffffffeca0);
          extract_obj(in_stack_ffffffffffffec90);
          get_obj_index(vnum);
          obj_00 = create_object(in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
          obj_to_room(obj_00,pRoomIndex);
        }
      }
    }
  }
  return;
}

Assistant:

void tick_prog_ilopheth(AREA_DATA *area)
{
	OBJ_DATA *pedestal = nullptr, *sphere = nullptr, *old_portal = nullptr, *new_portal = nullptr, *obj;
	ROOM_INDEX_DATA *pedroom = get_room_index(9096);
	ROOM_INDEX_DATA *portroom = get_room_index(9114);
	char buf[MSL];
	bool sph_found = false;

	if (time_info.day != 0 && time_info.day != 14)
		return;

	if ((time_info.hour != 15 && time_info.hour != 17) || time_info.half)
		return;

	if (area->sky >= WeatherCondition::Overcast)
		return;

	for (obj = pedroom->contents; obj; obj = obj->next_content)
	{
		if (obj->pIndexData->vnum == 9015)
		{
			pedestal = obj;
			break;
		}
	}

	if (!pedestal)
		return;

	for (obj = pedestal->contains; obj; obj = obj->next_content)
	{
		if (obj->pIndexData->vnum == 9016)
		{
			sphere = obj;
			sph_found = true;
			break;
		}
	}

	if (time_info.hour == 15)
	{
		if (!sph_found)
		{
			if (pedroom->people)
			{
				sprintf(buf, "%sAs the afternoon sun drops lower in the sky a single shaft of sunlight shines through a gap in the stones, coming to rest directly on the white marble pedestal.%s",
					get_char_color(pedroom->people, "yellow"),
					END_COLOR(pedroom->people));
				act(buf, pedroom->people, 0, 0, TO_ALL);
			}
		}
		else
		{
			if (pedroom->people)
			{
				sprintf(buf, "%sAs the afternoon sun drops lower in the sky a single shaft of sunlight shines through a gap in the stones, coming to rest directly on the white marble pedestal.%s",
					get_char_color(pedroom->people, "yellow"),
					END_COLOR(pedroom->people));
				act(buf, pedroom->people, 0, 0, TO_ALL);

				RS.Queue.AddToQueue(4, "tick_prog_ilopheth", "act_queue", act_queue, "The opacity of the crystal sphere appears to fade, and it begins to glow a brilliant white!", pedroom->people, nullptr, nullptr, TO_ALL);
				RS.Queue.AddToQueue(7, "tick_prog_ilopheth", "act_queue", act_queue, "To the northwest, an immense pillar of light ascends from the forest into the heavens!", pedroom->people, nullptr, nullptr, TO_ALL);
			}

			for (obj = portroom->contents; obj; obj = obj->next_content)
			{
				if (obj->pIndexData->vnum == 9009)
				{
					old_portal = obj;
					break;
				}
			}

			if (!old_portal)
			{
				return;
			}
			else
			{
				if (portroom->people)
				{
					sprintf(buf, "The mass of energy begins to glow a brilliant white, and releases an immense pillar of energy which streaks into the heavens.  The disturbance seems to stabilize into an arched, opalescent portal.");
					act(buf, portroom->people, 0, 0, TO_ALL);
				}

				obj_from_room(old_portal);
				extract_obj(old_portal);

				new_portal = create_object(get_obj_index(9008), 0);

				obj_to_room(new_portal, portroom);
			}
		}
	}

	if (time_info.hour == 17)
	{
		if (pedroom->people)
			act("As the sun descends toward the horizon, the shaft of light illuminating the pedestal fades to a spot, and disappears.", pedroom->people, 0, 0, TO_ALL);

		for (obj = portroom->contents; obj; obj = obj->next_content)
		{
			if (obj->pIndexData->vnum == 9008)
			{
				new_portal = obj;
				break;
			}
		}

		if (!new_portal)
		{
			return;
		}
		else
		{
			if (portroom->people)
				act("The opalescent gateway begins to break down, its edges flexing and twisting wildly.", portroom->people, 0, 0, TO_ALL);

			obj_from_room(new_portal);
			extract_obj(new_portal);

			old_portal = create_object(get_obj_index(9009), 0);

			obj_to_room(old_portal, portroom);
		}
	}
}